

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tftp.c
# Opt level: O0

CURLcode tftp_connect_for_rx(tftp_state_data_t *state,tftp_event_t event)

{
  Curl_easy *data;
  CURLcode result;
  tftp_event_t event_local;
  tftp_state_data_t *state_local;
  
  Curl_infof(state->conn->data,"%s\n","Connected for receive");
  state->state = TFTP_STATE_RX;
  state_local._4_4_ = tftp_set_timeouts(state);
  if (state_local._4_4_ == CURLE_OK) {
    state_local._4_4_ = tftp_rx(state,event);
  }
  return state_local._4_4_;
}

Assistant:

static CURLcode tftp_connect_for_rx(tftp_state_data_t *state,
                                    tftp_event_t event)
{
  CURLcode result;
#ifndef CURL_DISABLE_VERBOSE_STRINGS
  struct Curl_easy *data = state->conn->data;

  infof(data, "%s\n", "Connected for receive");
#endif
  state->state = TFTP_STATE_RX;
  result = tftp_set_timeouts(state);
  if(result)
    return result;
  return tftp_rx(state, event);
}